

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutPool.h
# Opt level: O0

void __thiscall HighsCutSet::resize(HighsCutSet *this,HighsInt nnz)

{
  size_type in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  size_type in_stack_00000008;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  HighsInt ncuts;
  
  numCuts((HighsCutSet *)0x5b3f4c);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_00000010,in_stack_00000008,(value_type_conflict1 *)unaff_retaddr);
  std::vector<double,_std::allocator<double>_>::resize(unaff_retaddr,in_RDI);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,in_RDI);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr,in_RDI);
  std::vector<double,_std::allocator<double>_>::resize(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void resize(HighsInt nnz) {
    HighsInt ncuts = numCuts();
    lower_.resize(ncuts, -kHighsInf);
    upper_.resize(ncuts);
    ARstart_.resize(ncuts + 1);
    ARindex_.resize(nnz);
    ARvalue_.resize(nnz);
  }